

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O0

ssize_t __thiscall
SubdirsMetaMakefileGenerator::write
          (SubdirsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  Subdir *pSVar1;
  bool bVar2;
  uint uVar3;
  qsizetype qVar4;
  const_reference ppSVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  int ind;
  Subdir *sub;
  int i;
  QString *output_name;
  QString *output_dir;
  QString *pwd;
  bool ret;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  QList<SubdirsMetaMakefileGenerator::Subdir_*> *in_stack_fffffffffffffeb0;
  QStringBuilder<QString_&,_const_char_(&)[2]> *in_stack_fffffffffffffeb8;
  int local_12c;
  int local_11c;
  byte local_f9;
  undefined1 local_88 [48];
  QFileInfo local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_f9 = 1;
  qmake_getpwd();
  QFile::fileName();
  local_11c = 0;
  while( true ) {
    bVar2 = false;
    if (local_f9 != 0) {
      in_stack_fffffffffffffeb8 = (QStringBuilder<QString_&,_const_char_(&)[2]> *)(long)local_11c;
      qVar4 = QList<SubdirsMetaMakefileGenerator::Subdir_*>::size(&this->subs);
      bVar2 = (long)in_stack_fffffffffffffeb8 < qVar4;
    }
    if (!bVar2) break;
    ppSVar5 = QList<SubdirsMetaMakefileGenerator::Subdir_*>::at
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    pSVar1 = *ppSVar5;
    qmake_setpwd((QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    QFileInfo::QFileInfo(local_58,(QString *)&pSVar1->output_dir);
    QFileInfo::absoluteFilePath();
    QString::operator=((QString *)in_stack_fffffffffffffeb0,
                       (QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    QString::~QString((QString *)0x1d88b2);
    QFileInfo::~QFileInfo(local_58);
    QFile::setFileName((QString *)Option::output);
    in_stack_fffffffffffffeb0 = (QList<SubdirsMetaMakefileGenerator::Subdir_*> *)(long)local_11c;
    qVar4 = QList<SubdirsMetaMakefileGenerator::Subdir_*>::size(&this->subs);
    if (in_stack_fffffffffffffeb0 != (QList<SubdirsMetaMakefileGenerator::Subdir_*> *)(qVar4 + -1))
    {
      for (local_12c = 0; local_12c < pSVar1->indent; local_12c = local_12c + 1) {
        printf(" ");
      }
      ::operator+((QString *)in_stack_fffffffffffffeb0,
                  (char (*) [2])CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      QFile::fileName();
      ::operator+(in_stack_fffffffffffffeb8,(QString *)in_stack_fffffffffffffeb0);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                 CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      QDir::cleanPath((QString *)local_88);
      QString::toLatin1((QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      pcVar6 = QByteArray::constData((QByteArray *)0x1d89cc);
      printf("Writing %s\n",pcVar6);
      QByteArray::~QByteArray((QByteArray *)0x1d89ea);
      QString::~QString((QString *)0x1d89f7);
      QString::~QString((QString *)0x1d8a04);
      QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)0x1d8a11);
      QString::~QString((QString *)0x1d8a1b);
    }
    uVar3 = (*pSVar1->makefile->_vptr_MetaMakefileGenerator[4])();
    local_f9 = (byte)uVar3 & 1;
    if ((uVar3 & 1) == 0) break;
    qmake_setpwd((QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    QFile::setFileName((QString *)Option::output);
    QString::operator=(&Option::output_dir,(QString *)&Option::output_dir);
    local_11c = local_11c + 1;
  }
  QString::~QString((QString *)0x1d8a88);
  QString::~QString((QString *)0x1d8a95);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_f9) & 0xffffffffffffff01;
}

Assistant:

bool
SubdirsMetaMakefileGenerator::write()
{
    bool ret = true;
    const QString &pwd = qmake_getpwd();
    const QString &output_dir = Option::output_dir;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < subs.size(); i++) {
        const Subdir *sub = subs.at(i);
        qmake_setpwd(sub->input_dir);
        Option::output_dir = QFileInfo(sub->output_dir).absoluteFilePath();
        Option::output.setFileName(sub->output_file);
        if(i != subs.size()-1) {
            for (int ind = 0; ind < sub->indent; ++ind)
                printf(" ");
            printf("Writing %s\n", QDir::cleanPath(Option::output_dir+"/"+
                                                   Option::output.fileName()).toLatin1().constData());
        }
        if (!(ret = sub->makefile->write()))
            break;
        //restore because I'm paranoid
        qmake_setpwd(pwd);
        Option::output.setFileName(output_name);
        Option::output_dir = output_dir;
    }
    return ret;
}